

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::RboComponentSizeColorCase::test
          (RboComponentSizeColorCase *this)

{
  CallLogWrapper *this_00;
  int r;
  uint in_EAX;
  long lVar1;
  ulong uStack_38;
  GLuint renderbufferID;
  
  uStack_38 = (ulong)in_EAX;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,renderbufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkRenderbufferComponentSize
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,0,
             0,0,0,0,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  lVar1 = 0x10;
  do {
    r = *(int *)(&UNK_01c17b24 + lVar1);
    glu::CallLogWrapper::glRenderbufferStorage
              (this_00,0x8d41,
               *(GLenum *)
                ("N4deqp5gles310Functional12_GLOBAL__N_125RboComponentSizeColorCaseE" + lVar1 + 0x40
                ),0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferComponentSize
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               r,*(int *)(&UNK_01c17b28 + lVar1),*(int *)(&UNK_01c17b2c + lVar1),
               *(int *)((long)&DAT_01c17b30 + lVar1),-1,-1);
    lVar1 = lVar1 + 0x14;
  } while (lVar1 != 0x240);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&renderbufferID);
  return;
}

Assistant:

void test (void)
	{
		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		checkRenderbufferComponentSize(m_testCtx, *this, 0, 0, 0, 0, 0, 0);
		expectError(GL_NO_ERROR);

		const struct ColorFormat
		{
			GLenum	internalFormat;
			int		bitsR, bitsG, bitsB, bitsA;
		} requiredColorFormats[] =
		{
			{ GL_R8,			8,	0,	0,	0	},
			{ GL_RG8,			8,	8,	0,	0	},
			{ GL_RGB8,			8,	8,	8,	0	},
			{ GL_RGB565,		5,	6,	5,	0	},
			{ GL_RGBA4,			4,	4,	4,	4	},
			{ GL_RGB5_A1,		5,	5,	5,	1	},
			{ GL_RGBA8,			8,	8,	8,	8	},
			{ GL_RGB10_A2,		10, 10, 10, 2	},
			{ GL_RGB10_A2UI,	10, 10, 10, 2	},
			{ GL_SRGB8_ALPHA8,	8,	8,	8,	8	},
			{ GL_R8I,			8,	0,	0,	0	},
			{ GL_R8UI,			8,	0,	0,	0	},
			{ GL_R16I,			16, 0,	0,	0	},
			{ GL_R16UI,			16, 0,	0,	0	},
			{ GL_R32I,			32, 0,	0,	0	},
			{ GL_R32UI,			32, 0,	0,	0	},
			{ GL_RG8I,			8,	8,	0,	0	},
			{ GL_RG8UI,			8,	8,	0,	0	},
			{ GL_RG16I,			16, 16, 0,	0	},
			{ GL_RG16UI,		16, 16, 0,	0	},
			{ GL_RG32I,			32, 32, 0,	0	},
			{ GL_RG32UI,		32, 32, 0,	0	},
			{ GL_RGBA8I,		8,	8,	8,	8	},
			{ GL_RGBA8UI,		8,	8,	8,	8	},
			{ GL_RGBA16I,		16, 16, 16, 16	},
			{ GL_RGBA16UI,		16, 16, 16, 16	},
			{ GL_RGBA32I,		32, 32, 32, 32	},
			{ GL_RGBA32UI,		32, 32, 32, 32	}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredColorFormats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredColorFormats[ndx].internalFormat, 128, 128);
			expectError(GL_NO_ERROR);

			checkRenderbufferComponentSize(m_testCtx, *this, requiredColorFormats[ndx].bitsR, requiredColorFormats[ndx].bitsG, requiredColorFormats[ndx].bitsB, requiredColorFormats[ndx].bitsA, -1, -1);
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}